

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O2

void ACustomBridge::InPlaceConstructor(void *mem)

{
  AActor::AActor((AActor *)mem);
  *(undefined ***)mem = &PTR_StaticType_006ffdd0;
  return;
}

Assistant:

void ACustomBridge::BeginPlay ()
{
	if (args[2]) // Hexen bridge if there are balls
	{
		SetState(SeeState);
		radius = args[0] ? args[0] : 32;
		Height = args[1] ? args[1] : 2;
	}
	else // No balls? Then a Doom bridge.
	{
		radius = args[0] ? args[0] : 36;
		Height = args[1] ? args[1] : 4;
		RenderStyle = STYLE_Normal;
	}
}